

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::CustomOptions_OptionLocations_Test::TestBody
          (CustomOptions_OptionLocations_Test *this)

{
  FieldDescriptor *this_00;
  FileDescriptor *pFVar1;
  bool bVar2;
  ServiceDescriptor *this_01;
  MethodDescriptor *this_02;
  FileOptions *this_03;
  char *pcVar3;
  MessageOptions *pMVar4;
  FieldOptions *pFVar5;
  OneofOptions *this_04;
  EnumOptions *this_05;
  EnumValueDescriptor *this_06;
  EnumValueOptions *this_07;
  ServiceOptions *this_08;
  MethodOptions *this_09;
  char *in_R9;
  AssertHelper local_2e0;
  Message local_2d8;
  CppStringType local_2d0;
  CppStringType local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_;
  Message local_268;
  ConstType local_260;
  MethodOpt1 local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_9;
  Message local_240;
  ConstType_conflict1 local_238;
  long local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_8;
  Message local_210;
  ConstType local_208;
  int local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_7;
  Message local_1e8;
  ConstType local_1e0;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_6;
  Message local_1c0;
  ConstType_conflict local_1b8 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_5;
  Message local_190;
  ConstType local_188;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_4;
  Message local_168;
  ConstType local_160;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  Message local_140;
  ConstType_conflict local_138 [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  ConstType local_108;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8 [3];
  ConstType_conflict local_d0 [2];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  MethodDescriptor *method;
  ServiceDescriptor *local_88;
  ServiceDescriptor *service;
  EnumDescriptor *local_70;
  EnumDescriptor *enm;
  FieldDescriptor *local_58;
  FieldDescriptor *map_field;
  OneofDescriptor *local_40;
  OneofDescriptor *oneof;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  FileDescriptor *file;
  Descriptor *message;
  CustomOptions_OptionLocations_Test *this_local;
  
  message = (Descriptor *)this;
  file = (FileDescriptor *)proto2_unittest::TestMessageWithCustomOptions::descriptor();
  field = (FieldDescriptor *)Descriptor::file((Descriptor *)file);
  pFVar1 = file;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&oneof,"field1");
  local_28 = Descriptor::FindFieldByName((Descriptor *)pFVar1,_oneof);
  pFVar1 = file;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&map_field,"AnOneof");
  local_40 = Descriptor::FindOneofByName((Descriptor *)pFVar1,_map_field);
  pFVar1 = file;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&enm,"map_field");
  local_58 = Descriptor::FindFieldByName((Descriptor *)pFVar1,_enm);
  pFVar1 = file;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&service,"AnEnum");
  local_70 = Descriptor::FindEnumTypeByName((Descriptor *)pFVar1,_service);
  this_00 = field;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&method,
             "TestServiceWithCustomOptions");
  this_01 = FileDescriptor::FindServiceByName((FileDescriptor *)this_00,_method);
  local_88 = this_01;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"Foo");
  this_02 = ServiceDescriptor::FindMethodByName(this_01,stack0xffffffffffffff50);
  local_d0[1] = 0x24cb016ea;
  this_03 = FileDescriptor::options((FileDescriptor *)field);
  local_d0[0] = FileOptions::
                GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false,_0>
                          (this_03,(ExtensionIdentifier<google::protobuf::FileOptions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                                    *)proto2_unittest::file_opt1);
  testing::internal::EqHelper::Compare<long,_unsigned_long,_nullptr>
            ((EqHelper *)local_c0,"int64_t{9876543210}",
             "file->options().GetExtension(proto2_unittest::file_opt1)",(long *)(local_d0 + 1),
             local_d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_104 = -0x38;
  pMVar4 = Descriptor::options((Descriptor *)file);
  local_108 = MessageOptions::
              GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                        (pMVar4,(ExtensionIdentifier<google::protobuf::MessageOptions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                 *)&proto2_unittest::message_opt1);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_100,"-56",
             "message->options().GetExtension(proto2_unittest::message_opt1)",&local_104,&local_108)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf1d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_138[1] = 0x20a75e12d;
  pFVar5 = FieldDescriptor::options(local_28);
  local_138[0] = FieldOptions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false,_0>
                           (pFVar5,(ExtensionIdentifier<google::protobuf::FieldOptions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                                    *)proto2_unittest::field_opt1);
  testing::internal::EqHelper::Compare<long,_unsigned_long,_nullptr>
            ((EqHelper *)local_128,"int64_t{8765432109}",
             "field->options().GetExtension(proto2_unittest::field_opt1)",(long *)(local_138 + 1),
             local_138);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_15c = 0x2a;
  pFVar5 = FieldDescriptor::options(local_28);
  local_160 = FieldOptions::
              GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                        (pFVar5,(ExtensionIdentifier<google::protobuf::FieldOptions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                 *)&proto2_unittest::field_opt2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_158,"42","field->options().GetExtension(proto2_unittest::field_opt2)"
             ,&local_15c,&local_160);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf21,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_184 = -99;
  this_04 = OneofDescriptor::options(local_40);
  local_188 = OneofOptions::
              GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                        (this_04,(ExtensionIdentifier<google::protobuf::OneofOptions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                  *)&proto2_unittest::oneof_opt1);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_180,"-99",
             "oneof->options().GetExtension(proto2_unittest::oneof_opt1)",&local_184,&local_188);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf22,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b8[1] = 0x3039;
  pFVar5 = FieldDescriptor::options(local_58);
  local_1b8[0] = FieldOptions::
                 GetExtension<google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false,_0>
                           (pFVar5,(ExtensionIdentifier<google::protobuf::FieldOptions,_google::protobuf::internal::PrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                                    *)proto2_unittest::field_opt1);
  testing::internal::EqHelper::Compare<long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1a8,"int64_t{12345}",
             "map_field->options().GetExtension(proto2_unittest::field_opt1)",
             (long *)(local_1b8 + 1),local_1b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1dc = -0x315;
  this_05 = EnumDescriptor::options(local_70);
  local_1e0 = EnumOptions::
              GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false,_0>
                        (this_05,(ExtensionIdentifier<google::protobuf::EnumOptions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                                  *)&proto2_unittest::enum_opt1);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d8,"-789","enm->options().GetExtension(proto2_unittest::enum_opt1)",
             &local_1dc,&local_1e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf25,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_204 = 0x7b;
  this_06 = EnumDescriptor::value(local_70,1);
  this_07 = EnumValueDescriptor::options(this_06);
  local_208 = EnumValueOptions::
              GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                        (this_07,(ExtensionIdentifier<google::protobuf::EnumValueOptions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                                  *)&proto2_unittest::enum_value_opt1);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_200,"123",
             "enm->value(1)->options().GetExtension( proto2_unittest::enum_value_opt1)",&local_204,
             &local_208);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf27,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_230 = -0x24cb016ea;
  this_08 = ServiceDescriptor::options(local_88);
  local_238 = ServiceOptions::
              GetExtension<google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false,_0>
                        (this_08,(ExtensionIdentifier<google::protobuf::ServiceOptions,_google::protobuf::internal::PrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                                  *)proto2_unittest::service_opt1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_228,"int64_t{-9876543210}",
             "service->options().GetExtension(proto2_unittest::service_opt1)",&local_230,&local_238)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(&local_240);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf29,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_25c = METHODOPT1_VAL2;
  this_09 = MethodDescriptor::options(this_02);
  local_260 = MethodOptions::
              GetExtension<google::protobuf::internal::EnumTypeTraits<proto2_unittest::MethodOpt1>,_(unsigned_char)__x0e_,_false,_0>
                        (this_09,(ExtensionIdentifier<google::protobuf::MethodOptions,_google::protobuf::internal::EnumTypeTraits<proto2_unittest::MethodOpt1>,_(unsigned_char)__x0e_,_false>
                                  *)&proto2_unittest::method_opt1);
  testing::internal::EqHelper::
  Compare<proto2_unittest::MethodOpt1,_proto2_unittest::MethodOpt1,_nullptr>
            ((EqHelper *)local_258,"proto2_unittest::METHODOPT1_VAL2",
             "method->options().GetExtension(proto2_unittest::method_opt1)",&local_25c,&local_260);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(&local_268);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf2b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  pMVar4 = Descriptor::options((Descriptor *)file);
  local_281 = MessageOptions::has_message_set_wire_format(pMVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_280,
               (AssertionResult *)"message->options().has_message_set_wire_format()","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2cc = FieldDescriptor::cpp_string_type(local_28);
  local_2d0 = kString;
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::FieldDescriptorLite::CppStringType,_google::protobuf::internal::FieldDescriptorLite::CppStringType,_nullptr>
            ((EqHelper *)local_2c8,"field->cpp_string_type()",
             "FieldDescriptor::CppStringType::kString",&local_2cc,&local_2d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar2) {
    testing::Message::Message(&local_2d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf2f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  return;
}

Assistant:

TEST(CustomOptions, OptionLocations) {
  const Descriptor* message =
      proto2_unittest::TestMessageWithCustomOptions::descriptor();
  const FileDescriptor* file = message->file();
  const FieldDescriptor* field = message->FindFieldByName("field1");
  const OneofDescriptor* oneof = message->FindOneofByName("AnOneof");
  const FieldDescriptor* map_field = message->FindFieldByName("map_field");
  const EnumDescriptor* enm = message->FindEnumTypeByName("AnEnum");
  // TODO: Support EnumValue options, once the compiler does.
  const ServiceDescriptor* service =
      file->FindServiceByName("TestServiceWithCustomOptions");
  const MethodDescriptor* method = service->FindMethodByName("Foo");

  EXPECT_EQ(int64_t{9876543210},
            file->options().GetExtension(proto2_unittest::file_opt1));
  EXPECT_EQ(-56,
            message->options().GetExtension(proto2_unittest::message_opt1));
  EXPECT_EQ(int64_t{8765432109},
            field->options().GetExtension(proto2_unittest::field_opt1));
  EXPECT_EQ(42,  // Check that we get the default for an option we don't set.
            field->options().GetExtension(proto2_unittest::field_opt2));
  EXPECT_EQ(-99, oneof->options().GetExtension(proto2_unittest::oneof_opt1));
  EXPECT_EQ(int64_t{12345},
            map_field->options().GetExtension(proto2_unittest::field_opt1));
  EXPECT_EQ(-789, enm->options().GetExtension(proto2_unittest::enum_opt1));
  EXPECT_EQ(123, enm->value(1)->options().GetExtension(
                     proto2_unittest::enum_value_opt1));
  EXPECT_EQ(int64_t{-9876543210},
            service->options().GetExtension(proto2_unittest::service_opt1));
  EXPECT_EQ(proto2_unittest::METHODOPT1_VAL2,
            method->options().GetExtension(proto2_unittest::method_opt1));

  // See that the regular options went through unscathed.
  EXPECT_TRUE(message->options().has_message_set_wire_format());
  EXPECT_EQ(field->cpp_string_type(), FieldDescriptor::CppStringType::kString);
}